

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRST.cxx
# Opt level: O0

int testRST(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  bool ret;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  char *pcVar6;
  void *this;
  streambuf *psVar7;
  bool local_12f1;
  string local_1210;
  string local_11f0;
  bool local_11ca;
  bool local_11c9;
  undefined1 local_11c8 [6];
  bool a_eol;
  bool e_eol;
  string a_line;
  string e_line;
  bool a_ret;
  bool e_ret;
  long lStack_1180;
  int lineno;
  ifstream a_fin;
  long local_f78;
  ifstream e_fin;
  undefined1 local_d70 [8];
  cmRST r;
  undefined1 local_2b8 [8];
  ofstream fout;
  string fname;
  string e_name;
  string local_70 [8];
  string a_name;
  allocator local_39;
  undefined1 local_38 [8];
  string dir;
  char **argv_local;
  int argc_local;
  
  dir.field_2._8_8_ = argv;
  if (argc == 2) {
    pcVar6 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_38,pcVar6,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_38,".");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_70,"testRST.actual",(allocator *)(e_name.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(e_name.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&fname.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "/testRST.expect");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fout.field_0x1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "/testRST.rst");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_2b8,pcVar6,_S_out);
    bVar1 = std::ios::operator!((ios *)(local_2b8 + (long)*(_func_int **)((long)local_2b8 + -0x18)))
    ;
    if ((bVar1 & 1) == 0) {
      cmRST::cmRST((cmRST *)local_d70,(ostream *)local_2b8,(string *)local_38);
      bVar2 = cmRST::ProcessFile((cmRST *)local_d70,(string *)&fout.field_0x1f8,false);
      if (!bVar2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Could not open input ");
        poVar4 = std::operator<<(poVar4,(string *)&fout.field_0x1f8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
      r.ReplaceName.field_2._13_3_ = 0;
      r.ReplaceName.field_2._M_local_buf[0xc] = !bVar2;
      cmRST::~cmRST((cmRST *)local_d70);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Could not open output ");
      poVar4 = std::operator<<(poVar4,local_70);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      r.ReplaceName.field_2._12_4_ = 1;
    }
    std::ofstream::~ofstream(local_2b8);
    std::__cxx11::string::~string((string *)&fout.field_0x1f8);
    if (r.ReplaceName.field_2._12_4_ == 0) {
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_f78,pcVar6,_S_in);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&stack0xffffffffffffee80,pcVar6,_S_in);
      bVar1 = std::ios::operator!((ios *)((long)&local_f78 + *(long *)(local_f78 + -0x18)));
      if ((bVar1 & 1) == 0) {
        bVar1 = std::ios::operator!((ios *)((long)&stack0xffffffffffffee80 +
                                           *(long *)(lStack_1180 + -0x18)));
        if ((bVar1 & 1) == 0) {
          e_line.field_2._12_4_ = 0;
          do {
            std::__cxx11::string::string((string *)(a_line.field_2._M_local_buf + 8));
            std::__cxx11::string::string((string *)local_11c8);
            bVar2 = cmsys::SystemTools::GetLineFromStream
                              ((istream *)&local_f78,(string *)(a_line.field_2._M_local_buf + 8),
                               &local_11c9,-1);
            ret = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&stack0xffffffffffffee80,(string *)local_11c8,&local_11ca,-1
                            );
            e_line.field_2._12_4_ = e_line.field_2._12_4_ + 1;
            if (((bVar2 != ret) ||
                (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)((long)&a_line.field_2 + 8),
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_11c8), bVar3)) ||
               ((local_11c9 & 1U) != (local_11ca & 1U))) {
              std::istream::seekg((long)&stack0xffffffffffffee80,_S_beg);
              poVar4 = std::operator<<((ostream *)&std::cerr,
                                       "Actual output does not match that expected on line ");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,e_line.field_2._12_4_);
              poVar4 = std::operator<<(poVar4,".");
              poVar4 = (ostream *)
                       std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              std::operator<<(poVar4,"Expected ");
              std::__cxx11::string::string
                        ((string *)&local_11f0,(string *)(a_line.field_2._M_local_buf + 8));
              reportLine((ostream *)&std::cerr,bVar2,&local_11f0,(bool)(local_11c9 & 1));
              std::__cxx11::string::~string((string *)&local_11f0);
              std::operator<<((ostream *)&std::cerr," but got ");
              std::__cxx11::string::string((string *)&local_1210,(string *)local_11c8);
              reportLine((ostream *)&std::cerr,ret,&local_1210,(bool)(local_11ca & 1));
              std::__cxx11::string::~string((string *)&local_1210);
              poVar4 = std::operator<<((ostream *)&std::cerr,".");
              poVar4 = (ostream *)
                       std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              poVar4 = std::operator<<(poVar4,"Actual output:");
              this = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>)
              ;
              psVar7 = (streambuf *)std::ifstream::rdbuf();
              std::ostream::operator<<(this,psVar7);
              argv_local._4_4_ = 1;
              r.ReplaceName.field_2._12_4_ = 1;
            }
            else {
              r.ReplaceName.field_2._12_4_ = 0;
            }
            std::__cxx11::string::~string((string *)local_11c8);
            std::__cxx11::string::~string((string *)(a_line.field_2._M_local_buf + 8));
            if (r.ReplaceName.field_2._12_4_ != 0) goto LAB_0014caff;
            local_12f1 = false;
            if (bVar2) {
              local_12f1 = ret;
            }
          } while (local_12f1 != false);
          argv_local._4_4_ = 0;
          r.ReplaceName.field_2._12_4_ = 1;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Could not open input ");
          poVar4 = std::operator<<(poVar4,local_70);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
          r.ReplaceName.field_2._12_4_ = 1;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Could not open input ");
        poVar4 = std::operator<<(poVar4,(string *)(fname.field_2._M_local_buf + 8));
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
        r.ReplaceName.field_2._12_4_ = 1;
      }
LAB_0014caff:
      std::ifstream::~ifstream(&stack0xffffffffffffee80);
      std::ifstream::~ifstream(&local_f78);
    }
    std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)local_38);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Usage: testRST <dir>");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int testRST(int argc, char* argv[])
{
  if(argc != 2)
    {
    std::cerr << "Usage: testRST <dir>" << std::endl;
    return 1;
    }
  std::string dir = argv[1];
  if(dir.empty())
    {
    dir = ".";
    }
  std::string a_name = "testRST.actual";
  std::string e_name = dir + "/testRST.expect";

  // Process the test RST file.
  {
  std::string fname = dir + "/testRST.rst";
  std::ofstream fout(a_name.c_str());
  if(!fout)
    {
    std::cerr << "Could not open output " << a_name << std::endl;
    return 1;
    }

  cmRST r(fout, dir);
  if(!r.ProcessFile(fname))
    {
    std::cerr << "Could not open input " << fname << std::endl;
    return 1;
    }
  }

  // Compare expected and actual outputs.
  std::ifstream e_fin(e_name.c_str());
  std::ifstream a_fin(a_name.c_str());
  if(!e_fin)
    {
    std::cerr << "Could not open input " << e_name << std::endl;
    return 1;
    }
  if(!a_fin)
    {
    std::cerr << "Could not open input " << a_name << std::endl;
    return 1;
    }
  int lineno = 0;
  bool e_ret;
  bool a_ret;
  do
    {
    std::string e_line;
    std::string a_line;
    bool e_eol;
    bool a_eol;
    e_ret = cmSystemTools::GetLineFromStream(e_fin, e_line, &e_eol);
    a_ret = cmSystemTools::GetLineFromStream(a_fin, a_line, &a_eol);
    ++lineno;
    if(e_ret != a_ret || e_line != a_line || e_eol != a_eol)
      {
      a_fin.seekg(0, std::ios::beg);
      std::cerr << "Actual output does not match that expected on line "
                << lineno << "." << std::endl << "Expected ";
      reportLine(std::cerr, e_ret, e_line, e_eol);
      std::cerr << " but got ";
      reportLine(std::cerr, a_ret, a_line, a_eol);
      std::cerr << "." << std::endl
                << "Actual output:" << std::endl
                << a_fin.rdbuf();
      return 1;
      }
    } while(e_ret && a_ret);
  return 0;
}